

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VtabCallDestroy(sqlite3 *db,int iDb,char *zTab)

{
  Table *p_00;
  VTable *pVTab;
  _func_int_sqlite3_vtab_ptr *xDestroy;
  VTable *p;
  Table *pTab;
  int rc;
  char *zTab_local;
  int iDb_local;
  sqlite3 *db_local;
  
  pTab._4_4_ = 0;
  p_00 = sqlite3FindTable(db,zTab,db->aDb[iDb].zDbSName);
  if ((p_00 != (Table *)0x0) && (p_00->pVTable != (VTable *)0x0)) {
    for (xDestroy = (_func_int_sqlite3_vtab_ptr *)p_00->pVTable;
        xDestroy != (_func_int_sqlite3_vtab_ptr *)0x0;
        xDestroy = *(_func_int_sqlite3_vtab_ptr **)(xDestroy + 0x28)) {
      if (0 < *(int *)(*(long *)(xDestroy + 0x10) + 8)) {
        return 6;
      }
    }
    pVTab = vtabDisconnectAll(db,p_00);
    pTab._4_4_ = (*pVTab->pMod->pModule->xDestroy)(pVTab->pVtab);
    if (pTab._4_4_ == 0) {
      pVTab->pVtab = (sqlite3_vtab *)0x0;
      p_00->pVTable = (VTable *)0x0;
      sqlite3VtabUnlock(pVTab);
    }
  }
  return pTab._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VtabCallDestroy(sqlite3 *db, int iDb, const char *zTab){
  int rc = SQLITE_OK;
  Table *pTab;

  pTab = sqlite3FindTable(db, zTab, db->aDb[iDb].zDbSName);
  if( pTab!=0 && ALWAYS(pTab->pVTable!=0) ){
    VTable *p;
    int (*xDestroy)(sqlite3_vtab *);
    for(p=pTab->pVTable; p; p=p->pNext){
      assert( p->pVtab );
      if( p->pVtab->nRef>0 ){
        return SQLITE_LOCKED;
      }
    }
    p = vtabDisconnectAll(db, pTab);
    xDestroy = p->pMod->pModule->xDestroy;
    assert( xDestroy!=0 );  /* Checked before the virtual table is created */
    rc = xDestroy(p->pVtab);
    /* Remove the sqlite3_vtab* from the aVTrans[] array, if applicable */
    if( rc==SQLITE_OK ){
      assert( pTab->pVTable==p && p->pNext==0 );
      p->pVtab = 0;
      pTab->pVTable = 0;
      sqlite3VtabUnlock(p);
    }
  }

  return rc;
}